

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlUnsetProp(xmlNodePtr node,xmlChar *name)

{
  xmlNodePtr cur;
  xmlAttrPtr prop;
  xmlChar *name_local;
  xmlNodePtr node_local;
  
  cur = (xmlNodePtr)xmlGetPropNodeInternal(node,name,(xmlChar *)0x0,0);
  if (cur == (xmlNodePtr)0x0) {
    node_local._4_4_ = -1;
  }
  else {
    xmlUnlinkNode(cur);
    xmlFreeProp((xmlAttrPtr)cur);
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

int
xmlUnsetProp(xmlNodePtr node, const xmlChar *name) {
    xmlAttrPtr prop;

    prop = xmlGetPropNodeInternal(node, name, NULL, 0);
    if (prop == NULL)
	return(-1);
    xmlUnlinkNode((xmlNodePtr) prop);
    xmlFreeProp(prop);
    return(0);
}